

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptConstFoldUnary
          (GlobOpt *this,Instr **pInstr,int32 intConstantValue,bool isUsingOriginalSrc1Value,
          Value **pDstVal)

{
  OpCode OVar1;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  uchar uVar5;
  BailOutKind BVar6;
  uint uVar7;
  uint uVar8;
  Opnd *pOVar9;
  RejitException *pRVar10;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  StackSym *currDstSym;
  StackSym *dstSym;
  Opnd *dst;
  DWORD local_68;
  DWORD ctz;
  DWORD clz;
  double local_58;
  FloatConstType fValue;
  bool doSetDstVal;
  IntConstOpnd *pIStack_48;
  bool isInt;
  Opnd *constOpnd;
  Instr **ppIStack_38;
  int32 value;
  Instr **instr;
  Value **pDstVal_local;
  bool isUsingOriginalSrc1Value_local;
  Instr **ppIStack_20;
  int32 intConstantValue_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  constOpnd._4_4_ = 0;
  fValue._7_1_ = 1;
  fValue._6_1_ = 1;
  local_58 = 0.0;
  ppIStack_38 = pInstr;
  instr = (Instr **)pDstVal;
  pDstVal_local._3_1_ = isUsingOriginalSrc1Value;
  pDstVal_local._4_4_ = intConstantValue;
  ppIStack_20 = pInstr;
  pInstr_local = (Instr **)this;
  bVar4 = DoConstFold(this);
  if (!bVar4) {
    return false;
  }
  pOVar9 = IR::Instr::GetDst(*ppIStack_38);
  if (pOVar9 != (Opnd *)0x0) {
    pOVar9 = IR::Instr::GetDst(*ppIStack_38);
    bVar4 = IR::Opnd::IsRegOpnd(pOVar9);
    if (!bVar4) {
      return false;
    }
  }
  OVar1 = (*ppIStack_38)->m_opcode;
  if (OVar1 == Incr_A) {
    bVar4 = IntMathCommon<int>::Inc(pDstVal_local._4_4_,(int *)((long)&constOpnd + 4));
    if (bVar4) {
      return false;
    }
  }
  else if (OVar1 == Decr_A) {
    bVar4 = IntMathCommon<int>::Dec(pDstVal_local._4_4_,(int *)((long)&constOpnd + 4));
    if (bVar4) {
      return false;
    }
  }
  else if (OVar1 == Neg_A) {
    if (pDstVal_local._4_4_ == 0) {
      return false;
    }
    bVar4 = IntMathCommon<int>::Neg(pDstVal_local._4_4_,(int *)((long)&constOpnd + 4));
    if (bVar4) {
      return false;
    }
  }
  else if (OVar1 == Not_A) {
    IntMathCommon<int>::Not(pDstVal_local._4_4_,(int *)((long)&constOpnd + 4));
  }
  else {
    if (OVar1 != Conv_Num) {
      if (OVar1 == Ld_A) {
        bVar4 = IR::Instr::HasBailOutInfo(*ppIStack_38);
        if (bVar4) {
          BVar6 = IR::Instr::GetBailOutKind(*ppIStack_38);
          if (BVar6 == BailOutExpectingString) {
            pRVar10 = (RejitException *)__cxa_allocate_exception(1);
            Js::RejitException::RejitException(pRVar10,DisableSwitchOptExpectingString);
            __cxa_throw(pRVar10,&Js::RejitException::typeinfo,0);
          }
          BVar6 = IR::Instr::GetBailOutKind(*ppIStack_38);
          if (BVar6 != BailOutExpectingInteger) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1c2d,"(instr->GetBailOutKind() == IR::BailOutExpectingInteger)",
                               "instr->GetBailOutKind() == IR::BailOutExpectingInteger");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          IR::Instr::ClearBailOutInfo(*ppIStack_38);
        }
        constOpnd._4_4_ = pDstVal_local._4_4_;
        if ((pDstVal_local._3_1_ & 1) != 0) {
          fValue._6_1_ = 0;
        }
        goto LAB_005961bc;
      }
      if (OVar1 == ToVar) {
        bVar4 = Js::TaggedInt::IsOverflow(pDstVal_local._4_4_);
        if (bVar4) {
          return false;
        }
        constOpnd._4_4_ = pDstVal_local._4_4_;
        IR::Instr::ClearBailOutInfo(*ppIStack_38);
        goto LAB_005961bc;
      }
      if (OVar1 != LdC_A_I4) {
        if (OVar1 == InlineMathAcos) {
          local_58 = Js::Math::Acos((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathAsin) {
          local_58 = Js::Math::Asin((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathAtan) {
          local_58 = Js::Math::Atan((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathCos) {
          local_58 = Js::Math::Cos((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathExp) {
          local_58 = Js::Math::Exp((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathLog) {
          local_58 = Js::Math::Log((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathSin) {
          local_58 = Js::Math::Sin((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathSqrt) {
          local_58 = sqrt((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathTan) {
          local_58 = tan((double)(int)pDstVal_local._4_4_);
          fValue._7_1_ = 0;
        }
        else if (OVar1 == InlineMathAbs) {
          if (pDstVal_local._4_4_ == 0x80000000) {
            pOVar9 = IR::Instr::GetDst(*ppIStack_38);
            bVar4 = IR::Opnd::IsInt32(pOVar9);
            if (!bVar4) {
              pRVar10 = (RejitException *)__cxa_allocate_exception(1);
              Js::RejitException::RejitException(pRVar10,AggressiveIntTypeSpecDisabled);
              __cxa_throw(pRVar10,&Js::RejitException::typeinfo,0);
            }
            constOpnd._4_4_ = 0x80000000;
          }
          else {
            constOpnd._4_4_ = pDstVal_local._4_4_;
            if ((int)pDstVal_local._4_4_ < 1) {
              constOpnd._4_4_ = -pDstVal_local._4_4_;
            }
          }
        }
        else if (OVar1 == InlineMathClz) {
          uVar5 = BitScanReverse(&local_68,pDstVal_local._4_4_);
          if (uVar5 == '\0') {
            constOpnd._4_4_ = 0x20;
          }
          else {
            constOpnd._4_4_ = 0x1f - local_68;
          }
          IR::Instr::ClearBailOutInfo(*ppIStack_38);
        }
        else if (OVar1 == Ctz) {
          this_00 = Func::GetJITFunctionBody(this->func);
          bVar4 = JITTimeFunctionBody::IsWasmFunction(this_00);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1ca3,"(func->GetJITFunctionBody()->IsWasmFunction())",
                               "func->GetJITFunctionBody()->IsWasmFunction()");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          bVar4 = IR::Instr::HasBailOutInfo(*ppIStack_38);
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1ca4,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          uVar5 = BitScanForward((PDWORD)((long)&dst + 4),pDstVal_local._4_4_);
          if (uVar5 == '\0') {
            constOpnd._4_4_ = 0x20;
          }
          else {
            constOpnd._4_4_ = dst._4_4_;
          }
        }
        else if (OVar1 == InlineMathCeil) {
          constOpnd._4_4_ = pDstVal_local._4_4_;
          IR::Instr::ClearBailOutInfo(*ppIStack_38);
        }
        else if (OVar1 == InlineMathFloor) {
          constOpnd._4_4_ = pDstVal_local._4_4_;
          IR::Instr::ClearBailOutInfo(*ppIStack_38);
        }
        else if (OVar1 == InlineMathRound) {
          constOpnd._4_4_ = pDstVal_local._4_4_;
          IR::Instr::ClearBailOutInfo(*ppIStack_38);
        }
        else {
          if (OVar1 != InlineMathFround) {
            return false;
          }
          local_58 = (double)(int)pDstVal_local._4_4_;
          fValue._7_1_ = 0;
        }
        goto LAB_005961bc;
      }
    }
    constOpnd._4_4_ = pDstVal_local._4_4_;
    if ((pDstVal_local._3_1_ & 1) != 0) {
      fValue._6_1_ = 0;
    }
  }
LAB_005961bc:
  CaptureByteCodeSymUses(this,*ppIStack_38);
  bVar4 = IR::Instr::HasBailOutInfo(*ppIStack_38);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ccf,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  if ((fValue._7_1_ & 1) == 0) {
    constOpnd._4_4_ = (uint)local_58;
    if ((local_58 == (double)(int)constOpnd._4_4_) &&
       (!NAN(local_58) && !NAN((double)(int)constOpnd._4_4_))) {
      fValue._7_1_ = 1;
    }
  }
  if ((fValue._7_1_ & 1) == 0) {
    pIStack_48 = (IntConstOpnd *)IR::FloatConstOpnd::New(local_58,TyFloat64,(*ppIStack_38)->m_func);
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
    if (bVar4) {
      Output::Print(L"TRACE ");
      bVar4 = IsLoopPrePass(this);
      if (bVar4) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %f\n",local_58);
      Output::Flush();
    }
  }
  else {
    pIStack_48 = IR::IntConstOpnd::New
                           ((long)(int)constOpnd._4_4_,TyInt32,(*ppIStack_38)->m_func,false);
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
    if (bVar4) {
      Output::Print(L"TRACE ");
      bVar4 = IsLoopPrePass(this);
      if (bVar4) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %d\n",(ulong)constOpnd._4_4_);
      Output::Flush();
    }
  }
  IR::Instr::ReplaceSrc1(*ppIStack_38,&pIStack_48->super_Opnd);
  OptSrc(this,&pIStack_48->super_Opnd,ppIStack_38,(Value **)0x0,(IndirOpnd *)0x0);
  pOVar9 = IR::Instr::GetDst(*ppIStack_38);
  bVar4 = IR::Opnd::IsRegOpnd(pOVar9);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ce8,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
  pSVar2 = pRVar12->m_sym;
  if ((fValue._7_1_ & 1) == 0) {
    pIVar13 = (Instr *)NewFloatConstantValue(this,local_58,pOVar9);
    *instr = pIVar13;
    bVar4 = IsTypeSpecPhaseOff(this->func);
    if (bVar4) {
      (*ppIStack_38)->m_opcode = LdC_A_R8;
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
      ToVarRegOpnd(this,pRVar12,this->currentBlock);
    }
    else {
      (*ppIStack_38)->m_opcode = LdC_F8_R8;
      pIVar13 = *ppIStack_38;
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
      ToFloat64Dst(this,pIVar13,pRVar12,this->currentBlock);
    }
  }
  else {
    bVar4 = StackSym::IsSingleDef(pSVar2);
    if (bVar4) {
      StackSym::SetIsIntConst(pSVar2,(long)(int)constOpnd._4_4_);
    }
    if ((fValue._6_1_ & 1) != 0) {
      pIVar13 = (Instr *)GetIntConstantValue(this,constOpnd._4_4_,*ppIStack_38,pOVar9);
      *instr = pIVar13;
    }
    bVar4 = IsTypeSpecPhaseOff(this->func);
    if (bVar4) {
      (*ppIStack_38)->m_opcode = LdC_A_I4;
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
      ToVarRegOpnd(this,pRVar12,this->currentBlock);
    }
    else {
      (*ppIStack_38)->m_opcode = Ld_I4;
      pIVar13 = *ppIStack_38;
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
      ToInt32Dst(this,pIVar13,pRVar12,this->currentBlock);
      pOVar9 = IR::Instr::GetDst(*ppIStack_38);
      pRVar12 = IR::Opnd::AsRegOpnd(pOVar9);
      pSVar2 = pRVar12->m_sym;
      bVar4 = StackSym::IsSingleDef(pSVar2);
      if (bVar4) {
        StackSym::SetIsIntConst(pSVar2,(long)(int)constOpnd._4_4_);
      }
    }
  }
  InvalidateInductionVariables(this,*ppIStack_38);
  return true;
}

Assistant:

bool
GlobOpt::OptConstFoldUnary(
    IR::Instr * *pInstr,
    const int32 intConstantValue,
    const bool isUsingOriginalSrc1Value,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value = 0;
    IR::Opnd *constOpnd;
    bool isInt = true;
    bool doSetDstVal = true;
    FloatConstType fValue = 0.0;

    if (!DoConstFold())
    {
        return false;
    }

    if (instr->GetDst() && !instr->GetDst()->IsRegOpnd())
    {
        return false;
    }

    switch(instr->m_opcode)
    {
    case Js::OpCode::Neg_A:
        if (intConstantValue == 0)
        {
            // Could fold to -0.0
            return false;
        }

        if (Int32Math::Neg(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Not_A:
        Int32Math::Not(intConstantValue, &value);
        break;

    case Js::OpCode::Ld_A:
        if (instr->HasBailOutInfo())
        {
            //The profile data for switch expr can be string and in GlobOpt we realize it is an int.
            if(instr->GetBailOutKind() == IR::BailOutExpectingString)
            {
                throw Js::RejitException(RejitReason::DisableSwitchOptExpectingString);
            }
            Assert(instr->GetBailOutKind() == IR::BailOutExpectingInteger);
            instr->ClearBailOutInfo();
        }
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Conv_Num:
    case Js::OpCode::LdC_A_I4:
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Incr_A:
        if (Int32Math::Inc(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Decr_A:
        if (Int32Math::Dec(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::InlineMathAcos:
        fValue = Js::Math::Acos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAsin:
        fValue = Js::Math::Asin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAtan:
        fValue = Js::Math::Atan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathCos:
        fValue = Js::Math::Cos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathExp:
        fValue = Js::Math::Exp((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathLog:
        fValue = Js::Math::Log((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSin:
        fValue = Js::Math::Sin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSqrt:
        fValue = ::sqrt((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathTan:
        fValue = ::tan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathFround:
        fValue = (double) (float) intConstantValue;
        isInt = false;
        break;

    case Js::OpCode::InlineMathAbs:
        if (intConstantValue == INT32_MIN)
        {
            if (instr->GetDst()->IsInt32())
            {
                // if dst is an int (e.g. in asm.js), we should coerce it, not convert to float
                value = static_cast<int32>(2147483648U);
            }
            else
            {
                // Rejit with AggressiveIntTypeSpecDisabled for Math.abs(INT32_MIN) because it causes dst
                // to be float type which could be different with previous type spec result in LoopPrePass
                throw Js::RejitException(RejitReason::AggressiveIntTypeSpecDisabled);
            }
        }
        else
        {
            value = ::abs(intConstantValue);
        }
        break;

    case Js::OpCode::InlineMathClz:
        DWORD clz;
        if (_BitScanReverse(&clz, intConstantValue))
        {
            value = 31 - clz;
        }
        else
        {
            value = 32;
        }
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::Ctz:
        Assert(func->GetJITFunctionBody()->IsWasmFunction());
        Assert(!instr->HasBailOutInfo());
        DWORD ctz;
        if (_BitScanForward(&ctz, intConstantValue))
        {
            value = ctz;
        }
        else
        {
            value = 32;
        }
        break;

    case Js::OpCode::InlineMathFloor:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathCeil:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathRound:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;
    case Js::OpCode::ToVar:
        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return false;
        }
        else
        {
            value = intConstantValue;
            instr->ClearBailOutInfo();
            break;
        }
    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    Assert(!instr->HasBailOutInfo()); // If we are, in fact, successful in constant folding the instruction, there is no point in having the bailoutinfo around anymore.
                                      // Make sure that it is cleared if it was initially present.
    if (!isInt)
    {
        value = (int32)fValue;
        if (fValue == (double)value)
        {
            isInt = true;
        }
    }
    if (isInt)
    {
        constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %d\n"), value);
    }
    else
    {
        constOpnd = IR::FloatConstOpnd::New(fValue, TyFloat64, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %f\n"), fValue);
    }
    instr->ReplaceSrc1(constOpnd);

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (isInt)
    {
        if (dstSym->IsSingleDef())
        {
            dstSym->SetIsIntConst(value);
        }

        if (doSetDstVal)
        {
            *pDstVal = GetIntConstantValue(value, instr, dst);
        }

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_I4;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_I4;
            this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);

            StackSym * currDstSym = instr->GetDst()->AsRegOpnd()->m_sym;
            if (currDstSym->IsSingleDef())
            {
                currDstSym->SetIsIntConst(value);
            }
        }
    }
    else
    {
        *pDstVal = NewFloatConstantValue(fValue, dst);

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_R8;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::LdC_F8_R8;
            this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
        }
    }

    InvalidateInductionVariables(instr);

    return true;
}